

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::stop(PathTracer *this)

{
  thread *this_00;
  size_type sVar1;
  reference pptVar2;
  int local_14;
  int i;
  PathTracer *this_local;
  
  switch(this->state) {
  case INIT:
  case READY:
    break;
  case VISUALIZE:
    while (sVar1 = std::
                   stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
                   ::size(&this->selectionHistory), 1 < sVar1) {
      std::
      stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
      ::pop(&this->selectionHistory);
    }
    this->state = READY;
    break;
  case RENDERING:
    this->continueRaytracing = false;
  case DONE:
    for (local_14 = 0; (ulong)(long)local_14 < this->numWorkerThreads; local_14 = local_14 + 1) {
      std::vector<std::thread_*,_std::allocator<std::thread_*>_>::operator[]
                (&this->workerThreads,(long)local_14);
      std::thread::join();
      pptVar2 = std::vector<std::thread_*,_std::allocator<std::thread_*>_>::operator[]
                          (&this->workerThreads,(long)local_14);
      this_00 = *pptVar2;
      if (this_00 != (thread *)0x0) {
        std::thread::~thread(this_00);
        operator_delete(this_00,8);
      }
    }
    this->state = READY;
  }
  return;
}

Assistant:

void PathTracer::stop() {
    switch (state) {
      case INIT:
      case READY:
        break;
      case VISUALIZE:
        while (selectionHistory.size() > 1) {
          selectionHistory.pop();
        }
        state = READY;
        break;
      case RENDERING:
        continueRaytracing = false;
      case DONE:
        for (int i=0; i<numWorkerThreads; i++) {
          workerThreads[i]->join();
          delete workerThreads[i];
        }
        state = READY;
        break;
    }
  }